

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdio.cpp
# Opt level: O0

SQRESULT sqstd_dofile(HSQUIRRELVM v,SQChar *filename,SQBool retval,SQBool printerror)

{
  SQInteger SVar1;
  SQRESULT SVar2;
  SQChar *in_RCX;
  HSQUIRRELVM in_RDX;
  HSQUIRRELVM in_RDI;
  SQInteger in_stack_00000020;
  HSQUIRRELVM in_stack_00000028;
  SQBool in_stack_00000818;
  SQChar *in_stack_00000820;
  HSQUIRRELVM in_stack_00000828;
  SQRESULT local_8;
  
  SVar1 = sq_gettop(in_RDI);
  if (SVar1 == 0) {
    local_8 = sq_throwerror(in_RDX,in_RCX);
  }
  else {
    SVar2 = sqstd_loadfile(in_stack_00000828,in_stack_00000820,in_stack_00000818);
    if (-1 < SVar2) {
      sq_push(in_RDX,(SQInteger)in_RCX);
      SVar2 = sq_call(in_stack_00000028,in_stack_00000020,(SQBool)v,(SQBool)filename);
      if (-1 < SVar2) {
        sq_remove(in_RDX,(SQInteger)in_RCX);
        return 1;
      }
      sq_pop(in_RDX,(SQInteger)in_RCX);
    }
    local_8 = -1;
  }
  return local_8;
}

Assistant:

SQRESULT sqstd_dofile(HSQUIRRELVM v,const SQChar *filename,SQBool retval,SQBool printerror)
{
    //at least one entry must exist in order for us to push it as the environment
    if(sq_gettop(v) == 0)
        return sq_throwerror(v,_SC("environment table expected"));

    if(SQ_SUCCEEDED(sqstd_loadfile(v,filename,printerror))) {
        sq_push(v,-2);
        if(SQ_SUCCEEDED(sq_call(v,1,retval,SQTrue))) {
            sq_remove(v,retval?-2:-1); //removes the closure
            return 1;
        }
        sq_pop(v,1); //removes the closure
    }
    return SQ_ERROR;
}